

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

char get_FMchar(FMFieldPtr field,void *data)

{
  if (field->data_type == char_type) {
    return *(char *)((long)data + field->offset);
  }
  fwrite("Get Char failed on invalid data type!\n",0x26,1,_stderr);
  exit(1);
}

Assistant:

extern char
get_FMchar(FMFieldPtr field, void *data)
{
    if (field->data_type == char_type) {
	return (char) *((char *) data + field->offset);
    } else {
	fprintf(stderr, "Get Char failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}